

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeSSA.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_111::TypeSSA::run(TypeSSA *this,Module *module_)

{
  TypeBuilder *this_00;
  __node_base_ptr *pp_Var1;
  _Hash_node_base *p_Var2;
  Module *pMVar3;
  pointer puVar4;
  Global *pGVar5;
  pointer puVar6;
  pointer ppEVar7;
  pointer puVar8;
  DataSegment *pDVar9;
  pointer puVar10;
  Function *pFVar11;
  char *pcVar12;
  long lVar13;
  char cVar14;
  bool bVar15;
  char cVar16;
  mapped_type *pmVar17;
  Struct *struct_;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  const_iterator cVar18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  long *plVar21;
  undefined8 *puVar22;
  undefined1 reuse;
  uint uVar23;
  __node_base_ptr p_Var24;
  size_type *psVar25;
  iterator __begin2;
  pointer ppEVar26;
  pointer puVar27;
  undefined1 auVar28 [8];
  _Hash_node_base *p_Var29;
  ulong uVar30;
  ElementSegment *pEVar31;
  size_t n;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar32;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_01;
  size_t i;
  uint __val;
  Type *this_02;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar33;
  pointer puVar34;
  Name root;
  string_view sVar35;
  undefined1 auStack_468 [8];
  NewFinder moduleFinder;
  ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_330 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  existingTypeNames;
  HeapType newType;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2e8 [6];
  undefined1 local_170 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typesSet;
  byte local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  key_type local_f0;
  value_type newType_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> typesVec;
  undefined1 auStack_c8 [8];
  Name newName;
  undefined1 local_a8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  HeapType oldType_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> intendedName;
  string __str;
  TypeBuilder builder;
  
  this->module = module_;
  if (((module_->features).features & 0x400) != 0) {
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_100 = std::
                _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp:90:16)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp:90:16)>
                ::_M_manager;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)&moduleFinder.news.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,module_,(Func *)&local_118);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    auStack_468 = (undefined1  [8])0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .replacep = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currModule = (Module *)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar3 = this->module;
    puVar33 = (pMVar3->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pMVar3->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction = (Function *)pMVar3;
    if (puVar33 != puVar4) {
      do {
        pGVar5 = (puVar33->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((pGVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_468,&pGVar5->init);
        }
        puVar33 = puVar33 + 1;
      } while (puVar33 != puVar4);
    }
    puVar32 = (pMVar3->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pMVar3->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 != puVar6) {
      do {
        pEVar31 = (puVar32->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar31->offset != (Expression *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_468,&pEVar31->offset);
          pEVar31 = (puVar32->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        ppEVar7 = (pEVar31->data).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar26 = (pEVar31->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppEVar26 != ppEVar7;
            ppEVar26 = ppEVar26 + 1) {
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)*ppEVar26;
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_468,(Expression **)&existingTypeNames._M_h._M_single_bucket);
        }
        puVar32 = puVar32 + 1;
      } while (puVar32 != puVar6);
    }
    puVar34 = (pMVar3->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pMVar3->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar34 != puVar8) {
      do {
        pDVar9 = (puVar34->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->offset != (Expression *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_468,&pDVar9->offset);
        }
        puVar34 = puVar34 + 1;
      } while (puVar34 != puVar8);
    }
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction = (Function *)0x0;
    puVar27 = (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 != puVar10) {
      do {
        pFVar11 = (puVar27->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((pFVar11->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)pFVar11;
          pmVar17 = std::
                    map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                    ::operator[]((map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                                  *)&analysis,(key_type *)&existingTypeNames._M_h._M_single_bucket);
          processNews(this,(News *)(pmVar17->
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        }
        puVar27 = puVar27 + 1;
      } while (puVar27 != puVar10);
    }
    processNews(this,(News *)moduleFinder.
                             super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                             .currModule);
    ppEVar26 = (this->newsToModify).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppEVar7 = (this->newsToModify).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar26 != ppEVar7) {
      n = (long)ppEVar26 - (long)ppEVar7 >> 3;
      TypeBuilder::TypeBuilder((TypeBuilder *)((long)&__str.field_2 + 8),n);
      this_00 = (TypeBuilder *)(&__str.field_2._M_allocated_capacity + 1);
      i = 0;
      uVar30 = 1;
      do {
        local_170 = (undefined1  [8])
                    wasm::Type::getHeapType
                              (&(this->newsToModify).
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[i]->type);
        bVar15 = HeapType::isStruct((HeapType *)local_170);
        if (bVar15) {
          struct_ = HeapType::getStruct((HeapType *)local_170);
          TypeBuilder::setHeapType(this_00,i,struct_);
        }
        else {
          HeapType::getArray((HeapType *)
                             &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
          existingTypeNames._M_h._M_single_bucket =
               (__node_base_ptr)analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
          TypeBuilder::setHeapType(this_00,i,(Array *)&existingTypeNames._M_h._M_single_bucket);
        }
        TypeBuilder::setSubType(this_00,i,(HeapType)local_170);
        bVar15 = uVar30 < n;
        i = uVar30;
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (bVar15);
      TypeBuilder::createRecGroup((TypeBuilder *)((long)&__str.field_2 + 8),0,n);
      TypeBuilder::build((BuildResult *)&typesSet._M_h._M_single_bucket,
                         (TypeBuilder *)((long)&__str.field_2 + 8));
      if (local_120 == 1) {
        __assert_fail("!result.getError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa2,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)&typesSet._M_h._M_single_bucket);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_a8,__x);
      if ((long)newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start - (long)local_a8 != (long)ppEVar26 - (long)ppEVar7
         ) {
        __assert_fail("newTypes.size() == num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa4,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&newType_1,this->module)
      ;
      std::
      _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_170,newType_1.id,
                 typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start,0,&existingTypeNames._M_h._M_single_bucket
                 ,local_330,&oldType_1);
      cVar18 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_170,(key_type *)local_a8);
      if (cVar18.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
        Fatal::Fatal((Fatal *)&existingTypeNames._M_h._M_single_bucket);
        Fatal::operator<<((Fatal *)&existingTypeNames._M_h._M_single_bucket,
                          (char (*) [50])"Rec group collision in TypeSSA! Please file a bug");
        Fatal::~Fatal((Fatal *)&existingTypeNames._M_h._M_single_bucket);
      }
      if (local_a8 !=
          (undefined1  [8])
          newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        auVar28 = local_a8;
        do {
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)((key_type *)auVar28)->id;
          cVar18 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_170,(key_type *)&existingTypeNames._M_h._M_single_bucket);
          if (cVar18.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
            __assert_fail("!typesSet.count(newType)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                          ,0xb8,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
          }
          auVar28 = (undefined1  [8])((long)auVar28 + 8);
        } while (auVar28 !=
                 (undefined1  [8])
                 newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      local_330 = (undefined1  [8])&existingTypeNames._M_h._M_rehash_policy._M_next_resize;
      existingTypeNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      existingTypeNames._M_h._M_bucket_count = 0;
      existingTypeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      existingTypeNames._M_h._M_element_count._0_4_ = 0x3f800000;
      existingTypeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      existingTypeNames._M_h._M_rehash_policy._4_4_ = 0;
      existingTypeNames._M_h._M_rehash_policy._M_next_resize = 0;
      pMVar3 = this->module;
      p_Var29 = (pMVar3->typeNames)._M_h._M_before_begin._M_nxt;
      if (p_Var29 != (_Hash_node_base *)0x0) {
        do {
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)local_330;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)existingTypeNames._M_h._M_single_bucket,p_Var29 + 2,
                     &existingTypeNames._M_h._M_single_bucket);
          p_Var29 = p_Var29->_M_nxt;
        } while (p_Var29 != (_Hash_node_base *)0x0);
      }
      this_01 = &pMVar3->typeNames;
      uVar30 = 0;
      do {
        this_02 = &(this->newsToModify).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar30]->type;
        newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)wasm::Type::getHeapType(this_02);
        local_f0.id = ((key_type *)((long)local_a8 + uVar30 * 8))->id;
        wasm::Type::Type((Type *)&existingTypeNames._M_h._M_single_bucket,(HeapType)local_f0.id,
                         NonNullable);
        this_02->id = (uintptr_t)existingTypeNames._M_h._M_single_bucket;
        cVar19 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_01->_M_h,
                        (key_type *)
                        &newTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
        if (cVar19.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
            ._M_cur != (__node_type *)0x0) {
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar12 = (pmVar20->name).super_IString.str._M_str;
          auStack_c8 = (undefined1  [8])&newName.super_IString.str._M_str;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_c8,pcVar12,pcVar12 + (pmVar20->name).super_IString.str._M_len
                    );
          plVar21 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)auStack_c8,newName.super_IString.str._M_len,0,'\x01');
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)local_2e8;
          p_Var24 = (__node_base_ptr)(plVar21 + 2);
          if ((__node_base_ptr)*plVar21 == p_Var24) {
            local_2e8[0]._M_buckets = &p_Var24->_M_nxt->_M_nxt;
            local_2e8[0]._M_bucket_count = plVar21[3];
          }
          else {
            local_2e8[0]._M_buckets = &p_Var24->_M_nxt->_M_nxt;
            existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)*plVar21;
          }
          lVar13 = plVar21[1];
          *plVar21 = (long)p_Var24;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          __val = this->nameCounter + 1;
          this->nameCounter = __val;
          cVar16 = '\x01';
          if (9 < __val) {
            uVar23 = __val;
            cVar14 = '\x04';
            do {
              cVar16 = cVar14;
              if (uVar23 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_008c9a0b;
              }
              if (uVar23 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_008c9a0b;
              }
              if (uVar23 < 10000) goto LAB_008c9a0b;
              bVar15 = 99999 < uVar23;
              uVar23 = uVar23 / 10000;
              cVar14 = cVar16 + '\x04';
            } while (bVar15);
            cVar16 = cVar16 + '\x01';
          }
LAB_008c9a0b:
          intendedName.field_2._8_8_ = &__str._M_string_length;
          std::__cxx11::string::_M_construct((ulong)((long)&intendedName.field_2 + 8),cVar16);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)intendedName.field_2._8_8_,(uint)__str._M_dataplus._M_p,__val);
          p_Var29 = (_Hash_node_base *)0xf;
          if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)existingTypeNames._M_h._M_single_bucket != local_2e8) {
            p_Var29 = (_Hash_node_base *)local_2e8[0]._M_buckets;
          }
          p_Var2 = (_Hash_node_base *)
                   (CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + lVar13);
          if (p_Var29 < p_Var2) {
            p_Var29 = (_Hash_node_base *)0xf;
            if ((size_type *)intendedName.field_2._8_8_ != &__str._M_string_length) {
              p_Var29 = (_Hash_node_base *)__str._M_string_length;
            }
            if (p_Var29 < p_Var2) goto LAB_008c9a7d;
            puVar22 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)((long)&intendedName.field_2 + 8),0,(char *)0x0,
                                 (ulong)existingTypeNames._M_h._M_single_bucket);
          }
          else {
LAB_008c9a7d:
            puVar22 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&existingTypeNames._M_h._M_single_bucket,
                                 intendedName.field_2._8_8_);
          }
          psVar25 = puVar22 + 2;
          if ((size_type *)*puVar22 == psVar25) {
            intendedName._M_string_length = *psVar25;
            intendedName.field_2._M_allocated_capacity = puVar22[3];
            oldType_1.id = (uintptr_t)&intendedName._M_string_length;
          }
          else {
            intendedName._M_string_length = *psVar25;
            oldType_1.id = (uintptr_t)*puVar22;
          }
          intendedName._M_dataplus._M_p = (pointer)puVar22[1];
          *puVar22 = psVar25;
          puVar22[1] = 0;
          *(undefined1 *)psVar25 = 0;
          if ((size_type *)intendedName.field_2._8_8_ != &__str._M_string_length) {
            operator_delete((void *)intendedName.field_2._8_8_,__str._M_string_length + 1);
          }
          reuse = SUB81(psVar25,0);
          if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)existingTypeNames._M_h._M_single_bucket != local_2e8) {
            operator_delete(existingTypeNames._M_h._M_single_bucket,
                            (ulong)((long)local_2e8[0]._M_buckets + 1));
          }
          if (auStack_c8 != (undefined1  [8])&newName.super_IString.str._M_str) {
            operator_delete((void *)auStack_c8,(ulong)(newName.super_IString.str._M_str + 1));
          }
          sVar35._M_str = (char *)0x0;
          sVar35._M_len = oldType_1.id;
          sVar35 = IString::interned((IString *)intendedName._M_dataplus._M_p,sVar35,(bool)reuse);
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)local_330;
          local_2e8[0]._M_bucket_count =
               (size_type)
               std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
               ::_M_invoke;
          local_2e8[0]._M_buckets =
               (__buckets_ptr)
               std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
               ::_M_manager;
          root.super_IString.str._M_str = (char *)&existingTypeNames._M_h._M_single_bucket;
          root.super_IString.str._M_len = (size_t)sVar35._M_str;
          sVar35 = (string_view)
                   Names::getValidName((Names *)sVar35._M_len,root,
                                       (function<bool_(wasm::Name)> *)
                                       std::
                                       _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
                                       ::_M_manager);
          if (local_2e8[0]._M_buckets != (__buckets_ptr)0x0) {
            pp_Var1 = &existingTypeNames._M_h._M_single_bucket;
            (*(code *)local_2e8[0]._M_buckets)(pp_Var1,pp_Var1,3);
          }
          _auStack_c8 = sVar35;
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          existingTypeNames._M_h._M_single_bucket =
               (__node_base_ptr)(pmVar20->name).super_IString.str._M_len;
          local_2e8[0]._M_buckets = (__buckets_ptr)0x0;
          local_2e8[0]._M_bucket_count = (pmVar20->fieldNames)._M_h._M_bucket_count;
          local_2e8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_2e8[0]._M_element_count = (pmVar20->fieldNames)._M_h._M_element_count;
          local_2e8[0]._M_rehash_policy._M_max_load_factor =
               (pmVar20->fieldNames)._M_h._M_rehash_policy._M_max_load_factor;
          local_2e8[0]._M_rehash_policy._4_4_ =
               *(undefined4 *)&(pmVar20->fieldNames)._M_h._M_rehash_policy.field_0x4;
          local_2e8[0]._M_rehash_policy._M_next_resize =
               (pmVar20->fieldNames)._M_h._M_rehash_policy._M_next_resize;
          intendedName.field_2._8_8_ = local_2e8;
          local_2e8[0]._M_single_bucket = (__node_base_ptr)0x0;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)intendedName.field_2._8_8_,&(pmVar20->fieldNames)._M_h,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
                      *)((long)&intendedName.field_2 + 8));
          sVar35 = _auStack_c8;
          existingTypeNames._M_h._M_single_bucket = (__node_base_ptr)auStack_c8;
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_f0);
          newType.id._0_4_ = sVar35._M_str._0_4_;
          newType.id._4_4_ = sVar35._M_str._4_4_;
          *(undefined4 *)&(pmVar20->name).super_IString.str._M_len =
               existingTypeNames._M_h._M_single_bucket._0_4_;
          *(undefined4 *)((long)&(pmVar20->name).super_IString.str._M_len + 4) =
               existingTypeNames._M_h._M_single_bucket._4_4_;
          *(undefined4 *)&(pmVar20->name).super_IString.str._M_str = (undefined4)newType.id;
          *(undefined4 *)((long)&(pmVar20->name).super_IString.str._M_str + 4) = newType.id._4_4_;
          if ((mapped_type *)&existingTypeNames._M_h._M_single_bucket != pmVar20) {
            std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pmVar20->fieldNames,local_2e8);
          }
          intendedName.field_2._8_8_ = local_330;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)intendedName.field_2._8_8_,(string *)auStack_c8,
                     (undefined1 *)((long)&intendedName.field_2 + 8));
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(local_2e8);
          if ((size_type *)oldType_1.id != &intendedName._M_string_length) {
            operator_delete((void *)oldType_1.id,intendedName._M_string_length + 1);
          }
        }
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (uVar30 < n);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_330);
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_170);
      if (newType_1.id != 0) {
        operator_delete((void *)newType_1.id,
                        (long)typesVec.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - newType_1.id);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a8,
                        (long)newTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_a8);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr[local_120]._M_data)
                ((anon_class_1_0_00000001 *)&existingTypeNames._M_h._M_single_bucket,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)&typesSet._M_h._M_single_bucket);
      TypeBuilder::~TypeBuilder((TypeBuilder *)((long)&__str.field_2 + 8));
    }
    if (moduleFinder.
        super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .currModule != (Module *)0x0) {
      operator_delete(moduleFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .currModule,
                      (long)moduleFinder.news.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .currModule);
    }
    if (moduleFinder.
        super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(moduleFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the struct/array.news.

    ModuleUtils::ParallelFunctionAnalysis<News> analysis(
      *module, [&](Function* func, News& news) {
        if (func->imported()) {
          return;
        }

        NewFinder finder;
        finder.walk(func->body);
        news = std::move(finder.news);
      });

    // Also find news in the module scope.
    NewFinder moduleFinder;
    moduleFinder.walkModuleCode(module);

    // Process all the news to find the ones we want to modify, adding them to
    // newsToModify. Note that we must do so in a deterministic order.
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { processNews(analysis.map[func]); });
    processNews(moduleFinder.news);

    // Modify the ones we found are relevant. We must modify them all at once as
    // in the isorecursive type system we want to create a single new rec group
    // for them all (see below).
    modifyNews();
  }